

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entries.hpp
# Opt level: O0

size_t binlog::
       serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                 (EventSource *entry,RecoverableVectorOutputStream *out)

{
  uint uVar1;
  size_t sVar2;
  uint32_t size;
  uint64_t tag;
  RecoverableVectorOutputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = mserialize::serialized_size<binlog::EventSource>((EventSource *)0x105f71);
  uVar1 = (int)sVar2 + 8;
  mserialize::serialize<unsigned_int,binlog::detail::RecoverableVectorOutputStream>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  mserialize::serialize<unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((unsigned_long *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  mserialize::serialize<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return (ulong)uVar1 + 4;
}

Assistant:

std::size_t serializeSizePrefixedTagged(const Entry& entry, OutputStream& out)
{
  const std::uint64_t tag = Entry::Tag;
  const std::uint32_t size = std::uint32_t(mserialize::serialized_size(entry) + sizeof(tag));
  mserialize::serialize(size, out);
  mserialize::serialize(tag, out);
  mserialize::serialize(entry, out);

  return size + sizeof(size);
}